

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermBranch * __thiscall
glslang::TIntermediate::addBranch
          (TIntermediate *this,TOperator branchOp,TIntermTyped *expression,TSourceLoc *loc)

{
  TIntermBranch *this_00;
  undefined4 in_register_00000034;
  TIntermBranch *node;
  TSourceLoc *loc_local;
  TIntermTyped *expression_local;
  TOperator branchOp_local;
  TIntermediate *this_local;
  
  this_00 = (TIntermBranch *)
            TIntermNode::operator_new((TIntermNode *)0x30,CONCAT44(in_register_00000034,branchOp));
  TIntermBranch::TIntermBranch(this_00,branchOp,expression);
  (*(this_00->super_TIntermNode)._vptr_TIntermNode[1])(this_00,loc);
  return this_00;
}

Assistant:

TIntermBranch* TIntermediate::addBranch(TOperator branchOp, TIntermTyped* expression, const TSourceLoc& loc)
{
    TIntermBranch* node = new TIntermBranch(branchOp, expression);
    node->setLoc(loc);

    return node;
}